

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O3

CNodeType * __thiscall
Refal2::CNodeList<Refal2::CHole>::Append(CNodeList<Refal2::CHole> *this,CHole *value)

{
  CNodeType *nodeAfter;
  int iVar1;
  undefined4 extraout_var;
  CNodeType *fromNode;
  
  nodeAfter = this->last;
  iVar1 = (*this->_vptr_CNodeList[3])();
  fromNode = (CNodeType *)CONCAT44(extraout_var,iVar1);
  if (nodeAfter == (CNodeType *)0x0) {
    this->first = fromNode;
    this->last = fromNode;
  }
  else {
    InsertAfter(this,nodeAfter,fromNode,fromNode);
    fromNode = this->last;
  }
  return fromNode;
}

Assistant:

typename CNodeList<T>::CNodeType* CNodeList<T>::Append( const T& value )
{
	if( last != nullptr ) {
		InsertAfter( last, value );
	} else {
		first = Alloc( value );
		last = first;
	}
	return last;
}